

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

HTTP_CLIENT_RESULT
uhttp_client_open(HTTP_CLIENT_HANDLE handle,char *host,int port_num,
                 ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect,void *callback_ctx)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  LOGGER_LOG l;
  HTTP_CLIENT_RESULT result;
  void *callback_ctx_local;
  ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect_local;
  int port_num_local;
  char *host_local;
  HTTP_CLIENT_HANDLE handle_local;
  
  if ((handle == (HTTP_CLIENT_HANDLE)0x0) || (host == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_open",0x47c,1,"Invalid handle value");
    }
    l._4_4_ = HTTP_CLIENT_INVALID_ARG;
  }
  else if ((((handle->recv_msg).recv_state == state_initial) ||
           ((handle->recv_msg).recv_state == state_error)) ||
          ((handle->recv_msg).recv_state == state_closed)) {
    if (handle->host_name != (char *)0x0) {
      free(handle->host_name);
      handle->host_name = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s(&handle->host_name,host);
    if (iVar1 == 0) {
      l._4_4_ = HTTP_CLIENT_OK;
      (handle->recv_msg).recv_state = state_opening;
      handle->on_connect = on_connect;
      handle->connect_user_ctx = callback_ctx;
      handle->port_num = port_num;
      if (((handle->x509_cert != (char *)0x0) && (handle->x509_pk != (char *)0x0)) &&
         ((iVar1 = xio_setoption(handle->xio_handle,"x509certificate",handle->x509_cert), iVar1 != 0
          || (iVar1 = xio_setoption(handle->xio_handle,"x509privatekey",handle->x509_pk), iVar1 != 0
             )))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"uhttp_client_open",0x4a5,1,"Failed setting x509 certificate");
        }
        l._4_4_ = HTTP_CLIENT_ERROR;
        free(handle->host_name);
        handle->host_name = (char *)0x0;
        handle->on_connect = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
        handle->connect_user_ctx = (void *)0x0;
        handle->port_num = 0;
      }
      if (((l._4_4_ == HTTP_CLIENT_OK) && (handle->certificate != (char *)0x0)) &&
         (iVar1 = xio_setoption(handle->xio_handle,"TrustedCerts",handle->certificate), iVar1 != 0))
      {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"uhttp_client_open",0x4b3,1,"Failed setting Trusted certificate");
        }
        l._4_4_ = HTTP_CLIENT_ERROR;
        free(handle->host_name);
        handle->host_name = (char *)0x0;
        handle->on_connect = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
        handle->connect_user_ctx = (void *)0x0;
        handle->port_num = 0;
      }
      if (l._4_4_ == HTTP_CLIENT_OK) {
        iVar1 = xio_open(handle->xio_handle,on_xio_open_complete,handle,on_bytes_received,handle,
                         on_io_error,handle);
        if (iVar1 == 0) {
          l._4_4_ = HTTP_CLIENT_OK;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_open",0x4c2,1,"opening xio failed");
          }
          free(handle->host_name);
          handle->host_name = (char *)0x0;
          handle->on_connect = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
          handle->connect_user_ctx = (void *)0x0;
          handle->port_num = 0;
          (handle->recv_msg).recv_state = state_error;
          l._4_4_ = HTTP_CLIENT_OPEN_FAILED;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"uhttp_client_open",0x494,1,"copying hostname has failed");
      }
      l._4_4_ = HTTP_CLIENT_ERROR;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_open",0x487,1,"Unable to open previously open client.");
    }
    l._4_4_ = HTTP_CLIENT_INVALID_STATE;
  }
  return l._4_4_;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_open(HTTP_CLIENT_HANDLE handle, const char* host, int port_num, ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect, void* callback_ctx)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL || host == NULL)
    {
        /* Codes_SRS_UHTTP_07_006: [If handle, io_interface_desc or host is NULL then `uhttp_client_open` shall return HTTP_CLIENT_INVALID_ARG] */
        LogError("Invalid handle value");
        result = HTTP_CLIENT_INVALID_ARG;
    }
    else
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;

        if ((http_data->recv_msg.recv_state != state_initial) &&
            (http_data->recv_msg.recv_state != state_error) &&
            (http_data->recv_msg.recv_state != state_closed))
        {
            LogError("Unable to open previously open client.");
            result = HTTP_CLIENT_INVALID_STATE;
        }
        else
        {
            if (http_data->host_name != NULL)
            {
                free(http_data->host_name);
                handle->host_name = NULL;
            }

            if (mallocAndStrcpy_s(&http_data->host_name, host) != 0)
            {
                LogError("copying hostname has failed");
                result = HTTP_CLIENT_ERROR;
            }
            /* Codes_SRS_UHTTP_07_007: [http_client_connect shall attempt to open the xio_handle. ] */
            else
            {
                result = HTTP_CLIENT_OK;
                http_data->recv_msg.recv_state = state_opening;
                http_data->on_connect = on_connect;
                http_data->connect_user_ctx = callback_ctx;
                http_data->port_num = port_num;

                if ((http_data->x509_cert != NULL) && (http_data->x509_pk != NULL))
                {
                    if ((xio_setoption(http_data->xio_handle, SU_OPTION_X509_CERT, http_data->x509_cert) != 0) ||
                        (xio_setoption(http_data->xio_handle, SU_OPTION_X509_PRIVATE_KEY, http_data->x509_pk) != 0))
                    {
                        LogError("Failed setting x509 certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if ((result == HTTP_CLIENT_OK) && (http_data->certificate != NULL))
                {
                    if (xio_setoption(http_data->xio_handle, OPTION_TRUSTED_CERT, http_data->certificate) != 0)
                    {
                        LogError("Failed setting Trusted certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if (result == HTTP_CLIENT_OK)
                {
                    if (xio_open(http_data->xio_handle, on_xio_open_complete, http_data, on_bytes_received, http_data, on_io_error, http_data) != 0)
                    {
                        /* Codes_SRS_UHTTP_07_044: [ if a failure is encountered on xio_open uhttp_client_open shall return HTTP_CLIENT_OPEN_REQUEST_FAILED. ] */
                        LogError("opening xio failed");
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                        http_data->recv_msg.recv_state = state_error;

                        result = HTTP_CLIENT_OPEN_FAILED;
                    }
                    else
                    {
                        /* Codes_SRS_UHTTP_07_008: [If http_client_connect succeeds then it shall return HTTP_CLIENT_OK] */
                        result = HTTP_CLIENT_OK;
                    }
                }
            }
        }
    }
    return result;
}